

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::Initialize(void)

{
  int headerVersion;
  ParmParse pp;
  MPI_Comm comm;
  int in_stack_ffffffffffffff64;
  int nstreams;
  string *prefix;
  undefined4 in_stack_ffffffffffffff70;
  int iVar1;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_79 [121];
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    comm = nOutFiles;
    ParallelDescriptor::Communicator();
    SetNOutFiles(in_stack_ffffffffffffff64,comm);
    nstreams = nMFFileInStreams;
    ParallelDescriptor::Communicator();
    SetMFFileInStreams(nstreams,comm);
    ExecOnFinalize((PTR_TO_VOID_FUNC)0x12194d5);
    prefix = (string *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_79 + 1),"vismf",(allocator *)prefix);
    ParmParse::ParmParse
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),prefix);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    ParmParse::queryAdd<int,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)prefix,(int *)CONCAT44(nstreams,comm));
    iVar1 = currentVersion;
    ParmParse::queryAdd<int,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,currentVersion),(char *)prefix,
               (int *)CONCAT44(nstreams,comm));
    if (iVar1 != currentVersion) {
      currentVersion = iVar1;
    }
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<long,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (long *)CONCAT44(nstreams,comm));
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)CONCAT44(in_stack_ffffffffffffff74,iVar1),(char *)prefix,
               (bool *)CONCAT44(nstreams,comm));
    (anonymous_namespace)::initialized = 1;
    ParmParse::~ParmParse((ParmParse *)0x12196de);
  }
  return;
}

Assistant:

void
VisMF::Initialize ()
{
    if(initialized) {
      return;
    }
    //
    // Use the same defaults as in Amr.cpp.
    //
    VisMF::SetNOutFiles(nOutFiles);

    VisMF::SetMFFileInStreams(nMFFileInStreams);

    amrex::ExecOnFinalize(VisMF::Finalize);

    ParmParse pp("vismf");
    pp.queryAdd("v",verbose);

    int headerVersion(currentVersion);
    pp.queryAdd("headerversion", headerVersion);
    if(headerVersion != currentVersion) {
      currentVersion = static_cast<VisMF::Header::Version> (headerVersion);
    }

    pp.queryAdd("groupsets", groupSets);
    pp.queryAdd("setbuf", setBuf);
    pp.queryAdd("usesingleread", useSingleRead);
    pp.queryAdd("usesinglewrite", useSingleWrite);
    pp.queryAdd("checkfilepositions", checkFilePositions);
    pp.queryAdd("usepersistentifstreams", usePersistentIFStreams);
    pp.queryAdd("usesynchronousreads", useSynchronousReads);
    pp.queryAdd("usedynamicsetselection", useDynamicSetSelection);
    pp.queryAdd("iobuffersize", ioBufferSize);
    pp.queryAdd("allowsparsewrites", allowSparseWrites);

    initialized = true;
}